

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<sptk::int24_t,_sptk::int24_t>::Run
          (DataTransform<sptk::int24_t,_sptk::int24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  NumericType NVar5;
  WarningType WVar6;
  bool bVar7;
  char *__nptr;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  undefined8 uVar14;
  ulong uVar15;
  ostream *poVar16;
  size_t sVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint8_t uVar21;
  uint uVar22;
  uint uVar23;
  int24_t *piVar24;
  ulong uVar25;
  uint in_R9D;
  undefined3 uVar26;
  uint uVar27;
  uint uVar28;
  byte bVar29;
  uint uVar30;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar31;
  int24_t input_data;
  string word;
  char buffer [128];
  int24_t local_2b0;
  byte local_2ad;
  uint local_2ac;
  uint local_2a8;
  int24_t local_2a2;
  int24_t local_29f;
  int local_29c;
  ulong local_298;
  uint local_290;
  ushort local_28a;
  int24_t *local_288;
  int24_t *local_280;
  ulong local_278;
  int local_26c;
  istream *local_268;
  ulong local_260;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_280 = &this->minimum_value_;
  local_288 = &this->maximum_value_;
  local_238 = &this->print_format_;
  uVar15 = 0;
  local_268 = input_stream;
  do {
    local_2b0.value[0] = '\0';
    local_2b0.value[1] = '\0';
    local_2b0.value[2] = 0;
    iVar9 = (int)uVar15;
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(local_268,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar7 = true;
        bVar8 = false;
      }
      else {
        piVar13 = __errno_location();
        iVar12 = *piVar13;
        *piVar13 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar14 = std::__throw_invalid_argument("stold");
LAB_0011c67f:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar14);
        }
        if (*piVar13 == 0) {
          *piVar13 = iVar12;
        }
        else if (*piVar13 == 0x22) {
          uVar14 = std::__throw_out_of_range("stold");
          goto LAB_0011c67f;
        }
        local_28a = in_FPUControlWord | 0xc00;
        local_26c = (int)ROUND(in_ST0);
        local_2b0.value._0_2_ = SUB42(local_26c,0);
        local_2b0.value[2] = (uint8_t)((uint)local_26c >> 0x10);
        bVar7 = false;
        bVar8 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar8) goto LAB_0011c19a;
      if (bVar7) {
        if (bVar7) {
LAB_0011c624:
          bVar8 = true;
          if ((this->is_ascii_output_ == true) && (iVar9 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_0011c669:
          bVar8 = false;
        }
        return bVar8;
      }
    }
    else {
      bVar8 = sptk::ReadStream<sptk::int24_t>(&local_2b0,local_268);
      if (!bVar8) goto LAB_0011c624;
LAB_0011c19a:
      uVar26 = (undefined3)(in_R9D >> 8);
      local_29c = CONCAT31(uVar26,local_2b0.value[0]);
      bVar1 = (this->minimum_value_).value[2];
      uVar30 = (uint)bVar1 * 0x10000;
      bVar29 = (this->minimum_value_).value[1];
      uVar22 = (uint)bVar29 << 8;
      uVar23 = (uint)(this->minimum_value_).value[0];
      uVar10 = uVar30 + uVar23 | uVar22;
      uVar20 = uVar10 | 0xff000000;
      if (-1 < (char)bVar1) {
        uVar20 = uVar10;
      }
      bVar2 = (this->maximum_value_).value[2];
      uVar27 = (uint)bVar2 * 0x10000;
      bVar3 = (this->maximum_value_).value[1];
      local_290 = (uint)bVar3;
      uVar28 = (uint)bVar3 << 8;
      bVar4 = (this->maximum_value_).value[0];
      local_278 = (ulong)bVar4;
      uVar18 = uVar27 + bVar4 | uVar28;
      uVar10 = uVar18 | 0xff000000;
      if (-1 < (char)bVar2) {
        uVar10 = uVar18;
      }
      uVar18 = (uint)local_2b0.value[0];
      uVar25 = (ulong)uVar18;
      in_R9D = CONCAT31(uVar26,local_2b0.value[2]);
      local_2ad = local_2b0.value[1];
      uVar19 = (uint)local_2b0.value[1];
      local_2a8 = (uint)local_2b0.value[2];
      local_260 = uVar15;
      if ((int)uVar20 < (int)uVar10) {
        NVar5 = this->input_numeric_type_;
        local_278._0_4_ = (uint)bVar4;
        piVar24 = local_280;
        uVar20 = (uint)bVar1;
        if (NVar5 == kFloatingPoint) {
          uVar10 = uVar19 * 0x100 + uVar18 | local_2a8 << 0x10;
LAB_0011c358:
          local_2ac = local_2a8 << 0x10;
          uVar18 = uVar10 | 0xff000000;
          if (-1 < (char)local_2b0.value[2]) {
            uVar18 = uVar10;
          }
          uVar22 = uVar30 | uVar23 | uVar22;
          uVar10 = uVar22 | 0xff000000;
          if (-1 < (char)bVar1) {
            uVar10 = uVar22;
          }
          uVar15 = (ulong)uVar10;
          if ((int)uVar10 <= (int)uVar18) {
            uVar28 = uVar27 | (uint)local_278 | uVar28;
            uVar10 = uVar28 | 0xff000000;
            if (-1 < (char)bVar2) {
              uVar10 = uVar28;
            }
            uVar15 = (ulong)uVar10;
            uVar22 = CONCAT12(local_2b0.value[2],local_2b0.value._0_2_) | 0xff000000;
            if (-1 < (char)local_2b0.value[2]) {
              uVar22 = (uint)CONCAT12(local_2b0.value[2],local_2b0.value._0_2_);
            }
            piVar24 = local_288;
            uVar20 = (uint)bVar2;
            local_298 = uVar25;
            bVar29 = bVar3;
            if ((int)uVar22 <= (int)uVar10) goto LAB_0011c47f;
          }
        }
        else {
          if (NVar5 != kUnsignedInteger) {
            if (NVar5 != kSignedInteger) goto LAB_0011c47f;
            uVar10 = uVar19 * 0x100 + uVar18 | local_2a8 << 0x10;
            goto LAB_0011c358;
          }
          local_2ac = local_2a8 << 0x10;
          uVar11 = uVar19 * 0x100 + uVar18 | local_2ac;
          uVar10 = uVar11 | 0xff000000;
          if (-1 < (char)local_2b0.value[2]) {
            uVar10 = uVar11;
          }
          uVar22 = uVar30 | uVar23 | uVar22;
          uVar23 = uVar22 | 0xff000000;
          if (-1 < (char)bVar1) {
            uVar23 = uVar22;
          }
          uVar15 = (ulong)uVar23;
          if (uVar23 <= uVar10) {
            uVar28 = uVar27 | (uint)local_278 | uVar28;
            uVar10 = uVar28 | 0xff000000;
            if (-1 < (char)bVar2) {
              uVar10 = uVar28;
            }
            uVar15 = (ulong)uVar10;
            uVar20 = uVar19 * 0x100 | uVar18 | local_2ac;
            uVar22 = uVar20 | 0xff000000;
            if (-1 < (char)local_2b0.value[2]) {
              uVar22 = uVar20;
            }
            piVar24 = local_288;
            uVar20 = (uint)bVar2;
            local_298 = uVar25;
            bVar29 = bVar3;
            if (uVar22 <= uVar10) goto LAB_0011c47f;
          }
        }
        local_2ac = local_2a8 << 0x10;
        uVar21 = (uint8_t)uVar20;
        local_29c = (int)CONCAT71((int7)(uVar15 >> 8),piVar24->value[0]);
        local_298 = uVar25;
        if (this->warning_type_ == kIgnore) {
LAB_0011c4ba:
          uVar21 = (uint8_t)uVar20;
          iVar12 = local_29c;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar6 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar12 = local_29c;
          if (WVar6 == kExit) goto LAB_0011c669;
        }
      }
      else {
LAB_0011c47f:
        uVar20 = in_R9D;
        bVar29 = local_2b0.value[1];
        if (this->rounding_ != true) goto LAB_0011c4ba;
        uVar20 = (uint)CONCAT12(local_2b0.value[2],local_2b0.value._0_2_);
        if ((char)local_2b0.value[2] < '\0') {
LAB_0011c4c2:
          uVar10 = uVar20 - 0x1000000;
          if (-1 < (char)local_2b0.value[2]) {
            uVar10 = uVar20;
          }
          dVar31 = (double)(int)uVar10 + -0.5;
        }
        else {
          if (uVar20 == 0) {
            uVar20 = 0;
            goto LAB_0011c4c2;
          }
          dVar31 = (double)uVar20 + 0.5;
        }
        iVar12 = (int)dVar31;
        bVar29 = (byte)((uint)iVar12 >> 8);
        uVar21 = (uint8_t)((uint)iVar12 >> 0x10);
      }
      if (this->is_ascii_output_ == true) {
        local_29f.value[0] = (uint8_t)iVar12;
        local_29f.value[1] = bVar29;
        local_29f.value[2] = uVar21;
        bVar8 = sptk::SnPrintf<sptk::int24_t>(&local_29f,local_238,0x80,local_b8);
        if (!bVar8) goto LAB_0011c669;
        sVar17 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar17);
        if ((iVar9 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        local_2a2.value[0] = (uint8_t)iVar12;
        local_2a2.value[1] = bVar29;
        local_2a2.value[2] = uVar21;
        bVar8 = sptk::WriteStream<sptk::int24_t>(&local_2a2,(ostream *)&std::cout);
        if (!bVar8) goto LAB_0011c669;
      }
    }
    uVar15 = (ulong)(iVar9 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }